

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

void __thiscall tl::StrT<char>::resizeNoCopy(StrT<char> *this,u32 size)

{
  char *pcVar1;
  char *str;
  u32 size_local;
  StrT<char> *this_local;
  
  if (size != 0) {
    pcVar1 = growIfNeeded(this,size);
    if (pcVar1 != (char *)0x0) {
      if ((this->_str != &s_emptyStr<char>) && (this->_str != (char *)0x0)) {
        operator_delete__(this->_str);
      }
      this->_str = pcVar1;
    }
    this->_size = size;
    this->_str[size] = '\0';
  }
  return;
}

Assistant:

void StrT<CharT>::resizeNoCopy(u32 size)
{
    if(size == 0)
        return;
    if(auto str = growIfNeeded(size)) {
        if(_str != s_emptyStr<CharT>) {
            delete[] _str;
        }
        _str = str;
    }
    _size = size;
    _str[size] = 0;
}